

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

ALCcontext * alcGetCurrentContext(void)

{
  ALCcontext *retval;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alcGetCurrentContext);
  (*REAL_alcGetCurrentContext)();
  IO_PTR(current_context);
  check_alc_error_events((DeviceWrapper *)0x0);
  check_al_async_states();
  APIUNLOCK();
  return (ALCcontext *)current_context;
}

Assistant:

ALCcontext *alcGetCurrentContext(void)
{
    ALCcontext *retval;
    IO_START(alcGetCurrentContext);
    retval = REAL_alcGetCurrentContext();
    (void) retval; // !!! FIXME: assert this hasn't gone out of sync with current_context...
    IO_PTR(current_context);
    IO_END_ALC(NULL);
    return (ALCcontext *) current_context;
}